

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

uint aom_highbd_sad16x8_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  uint uVar1;
  uint16_t *secp;
  uint16_t *refp;
  uint16_t *srcp;
  __m256i sad;
  uint16_t *in_stack_00000040;
  int in_stack_0000004c;
  uint16_t *in_stack_00000050;
  __m256i *in_stack_ffffffffffffff70;
  
  sad16x4(in_stack_00000050,in_stack_0000004c,in_stack_00000040,sad[3]._4_4_,(uint16_t *)sad[2],
          (__m256i *)sad[1]);
  sad16x4(in_stack_00000050,in_stack_0000004c,in_stack_00000040,sad[3]._4_4_,(uint16_t *)sad[2],
          (__m256i *)sad[1]);
  uVar1 = get_sad_from_mm256_epi32(in_stack_ffffffffffffff70);
  return uVar1;
}

Assistant:

unsigned int aom_highbd_sad16x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);

  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);

  // Next 4 rows
  srcp += src_stride << 2;
  refp += ref_stride << 2;
  secp += 64;
  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);
  return get_sad_from_mm256_epi32(&sad);
}